

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleCreateLinkCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *name;
  cmMakefile *this_00;
  __type _Var1;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  string result;
  string fileName;
  cmCommandArgumentsHelper argHelper;
  string newFileName;
  cmCommandArgumentGroup group;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  cmCAString resultArg;
  cmCAEnabler symbolicArg;
  cmCAString newFileArg;
  cmCAString fileArg;
  cmCAString linkArg;
  ostringstream e;
  cmCAEnabler copyOnErrorArg;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CREATE_LINK must be called with at least two additional arguments",
               (allocator<char> *)&linkArg);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  argHelper.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argHelper.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argHelper.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  group.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  group.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  group.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCAString::cmCAString(&linkArg,&argHelper,"CREATE_LINK",(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString(&fileArg,&argHelper,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString(&newFileArg,&argHelper,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString(&resultArg,&argHelper,"RESULT",&group);
  cmCAEnabler::cmCAEnabler(&copyOnErrorArg,&argHelper,"COPY_ON_ERROR",&group);
  cmCAEnabler::cmCAEnabler(&symbolicArg,&argHelper,"SYMBOLIC",&group);
  cmCommandArgument::Follows(&linkArg.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgument::Follows(&fileArg.super_cmCommandArgument,&linkArg.super_cmCommandArgument);
  cmCommandArgument::Follows(&newFileArg.super_cmCommandArgument,&fileArg.super_cmCommandArgument);
  cmCommandArgumentGroup::Follows(&group,&newFileArg.super_cmCommandArgument);
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&argHelper,args,&unconsumedArgs);
  if (unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+(&fileName,"unknown argument: \"",
                   unconsumedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,&fileName
                   ,'\"');
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&fileName);
    bVar2 = false;
    goto LAB_001bd114;
  }
  std::__cxx11::string::string((string *)&fileName,(string *)&fileArg.String);
  std::__cxx11::string::string((string *)&newFileName,(string *)&newFileArg.String);
  name = &resultArg.String;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  _Var1 = std::operator==(&fileName,&newFileName);
  if (_Var1) {
    std::__cxx11::string::assign((char *)&result);
LAB_001bce49:
    if (resultArg.String._M_string_length == 0) {
      cmCommand::SetError(&this->super_cmCommand,&result);
LAB_001bcef7:
      bVar2 = false;
    }
    else {
      bVar2 = true;
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,result._M_dataplus._M_p);
    }
  }
  else {
    if ((symbolicArg.Enabled == false) &&
       (bVar2 = cmsys::SystemTools::FileExists(&fileName), !bVar2)) {
      std::operator+(&local_508,"Cannot hard link \'",&fileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     &local_508,"\' as it does not exist.");
      std::__cxx11::string::operator=((string *)&result,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_508);
      goto LAB_001bce49;
    }
    bVar2 = cmsys::SystemTools::FileExists(&newFileName);
    if (((!bVar2) && (bVar2 = cmsys::SystemTools::FileIsSymlink(&newFileName), !bVar2)) ||
       (bVar2 = cmsys::SystemTools::RemoveFile(&newFileName), bVar2)) {
      if (symbolicArg.Enabled == true) {
        bVar2 = cmSystemTools::CreateSymlink(&fileName,&newFileName,&result);
      }
      else {
        bVar2 = cmSystemTools::CreateLink(&fileName,&newFileName,&result);
      }
      if (bVar2 != false) {
LAB_001bd016:
        std::__cxx11::string::assign((char *)&result);
        if (resultArg.String._M_string_length == 0) {
          bVar2 = true;
        }
        else {
LAB_001bd0ad:
          bVar2 = true;
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,result._M_dataplus._M_p);
        }
        goto LAB_001bd0f3;
      }
      if (copyOnErrorArg.Enabled == true) {
        bVar2 = cmsys::SystemTools::CopyFileAlways(&fileName,&newFileName);
        if (bVar2) goto LAB_001bd016;
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       "Copy failed: ",&local_508);
        std::__cxx11::string::operator=((string *)&result,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::~string((string *)&local_508);
      }
      if (resultArg.String._M_string_length != 0) goto LAB_001bd0ad;
      cmCommand::SetError(&this->super_cmCommand,&result);
      goto LAB_001bcef7;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,"Failed to create link \'");
    poVar3 = std::operator<<(poVar3,(string *)&newFileName);
    poVar3 = std::operator<<(poVar3,"\' because existing path cannot be removed: ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&local_508);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_508);
    bVar2 = resultArg.String._M_string_length != 0;
    if (resultArg.String._M_string_length == 0) {
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_508);
    }
    else {
      this_00 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::AddDefinition(this_00,name,local_508._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
LAB_001bd0f3:
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&newFileName);
  std::__cxx11::string::~string((string *)&fileName);
LAB_001bd114:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unconsumedArgs);
  cmCommandArgument::~cmCommandArgument(&symbolicArg.super_cmCommandArgument);
  cmCommandArgument::~cmCommandArgument(&copyOnErrorArg.super_cmCommandArgument);
  cmCAString::~cmCAString(&resultArg);
  cmCAString::~cmCAString(&newFileArg);
  cmCAString::~cmCAString(&fileArg);
  cmCAString::~cmCAString(&linkArg);
  std::_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::~_Vector_base
            ((_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *)&group);
  std::_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::~_Vector_base
            ((_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *)&argHelper);
  return bVar2;
}

Assistant:

bool cmFileCommand::HandleCreateLinkCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("CREATE_LINK must be called with at least two additional "
                   "arguments");
    return false;
  }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString linkArg(&argHelper, "CREATE_LINK");
  cmCAString fileArg(&argHelper, nullptr);
  cmCAString newFileArg(&argHelper, nullptr);

  cmCAString resultArg(&argHelper, "RESULT", &group);
  cmCAEnabler copyOnErrorArg(&argHelper, "COPY_ON_ERROR", &group);
  cmCAEnabler symbolicArg(&argHelper, "SYMBOLIC", &group);

  linkArg.Follows(nullptr);
  fileArg.Follows(&linkArg);
  newFileArg.Follows(&fileArg);
  group.Follows(&newFileArg);

  std::vector<std::string> unconsumedArgs;
  argHelper.Parse(&args, &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    this->SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  std::string fileName = fileArg.GetString();
  std::string newFileName = newFileArg.GetString();

  // Output variable for storing the result.
  const std::string& resultVar = resultArg.GetString();

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!resultVar.empty()) {
      this->Makefile->AddDefinition(resultVar, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!symbolicArg.IsEnabled() && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!resultVar.empty()) {
      this->Makefile->AddDefinition(resultVar, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if ((cmSystemTools::FileExists(newFileName) ||
       cmSystemTools::FileIsSymlink(newFileName)) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    std::ostringstream e;
    e << "Failed to create link '" << newFileName
      << "' because existing path cannot be removed: "
      << cmSystemTools::GetLastSystemError() << "\n";

    if (!resultVar.empty()) {
      this->Makefile->AddDefinition(resultVar, e.str().c_str());
      return true;
    }
    this->SetError(e.str());
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (symbolicArg.IsEnabled()) {
    completed = cmSystemTools::CreateSymlink(fileName, newFileName, &result);
  } else {
    completed = cmSystemTools::CreateLink(fileName, newFileName, &result);
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && copyOnErrorArg.IsEnabled()) {
    completed = cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (!completed) {
      result = "Copy failed: " + cmSystemTools::GetLastSystemError();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (resultVar.empty()) {
    // The operation failed and the result is not reported in a variable.
    this->SetError(result);
    return false;
  }

  if (!resultVar.empty()) {
    this->Makefile->AddDefinition(resultVar, result.c_str());
  }

  return true;
}